

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

single_learner * LEARNER::as_singleline<scorer,example>(learner<scorer,_example> *l)

{
  undefined8 uVar1;
  single_learner *in_RDI;
  stringstream __msg;
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  vw_exception *in_stack_fffffffffffffe60;
  stringstream local_190 [16];
  ostream local_180;
  
  if (((byte)in_RDI[0xe8] & 1) == 0) {
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(&local_180,"Tried to use a multiline reduction as a singleline reduction");
  uVar1 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

single_learner* as_singleline(learner<T, E>* l)
{
  if (!l->is_multiline)  // Tried to use a multiline reduction as a singleline reduction
    return (single_learner*)(l);
  THROW("Tried to use a multiline reduction as a singleline reduction");
}